

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O0

void __thiscall BSA_SpikeDecodingSynapse::update(BSA_SpikeDecodingSynapse *this)

{
  reference ppEVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RDI;
  int j;
  int i;
  value_type_conflict3 *in_stack_ffffffffffffffa8;
  ValueEvent *in_stack_ffffffffffffffb0;
  long *value;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  Logging *in_stack_ffffffffffffffd0;
  int local_1c;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x88); local_c = local_c + 1) {
    std::
    vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x50),(long)local_c);
    std::deque<double,_std::allocator<double>_>::pop_front
              ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0);
    std::
    vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x50),(long)local_c);
    std::deque<double,_std::allocator<double>_>::push_back
              ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    ppEVar1 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                         (long)local_c);
    if ((*ppEVar1)->type == Spike) {
      for (local_1c = 0; (double)local_1c < **(double **)(in_RDI + 0x18); local_1c = local_1c + 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),
                            (long)local_1c);
        in_stack_ffffffffffffffd0 = (Logging *)*pvVar2;
        std::
        vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                      *)(in_RDI + 0x50),(long)local_c);
        pvVar3 = std::deque<double,_std::allocator<double>_>::operator[]
                           ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0,
                            (size_type)in_stack_ffffffffffffffa8);
        *pvVar3 = (double)in_stack_ffffffffffffffd0 + *pvVar3;
      }
    }
    ppEVar1 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x70),(long)local_c)
    ;
    in_stack_ffffffffffffffb0 = (ValueEvent *)*ppEVar1;
    std::
    vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x50),(long)local_c);
    pvVar3 = std::deque<double,_std::allocator<double>_>::operator[]
                       ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0,
                        (size_type)in_stack_ffffffffffffffa8);
    ValueEvent::setValue
              (in_stack_ffffffffffffffb0,*pvVar3 * *(double *)(*(long *)(in_RDI + 0x18) + 8));
    value = *(long **)(in_RDI + 0x10);
    ppEVar1 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x70),(long)local_c)
    ;
    (**(code **)(*value + 0x28))(value,0,*ppEVar1);
    uVar4 = *(undefined8 *)(in_RDI + 0x90);
    iVar5 = local_c;
    std::
    vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x50),(long)local_c);
    std::deque<double,_std::allocator<double>_>::operator[]
              ((deque<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0,
               (size_type)in_stack_ffffffffffffffa8);
    Logging::logValue(in_stack_ffffffffffffffd0,CONCAT44(iVar5,in_stack_ffffffffffffffc8),
                      (int)((ulong)uVar4 >> 0x20),(int)uVar4,(double)value);
  }
  return;
}

Assistant:

void BSA_SpikeDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        input[i].pop_front();
        input[i].push_back(0);
        if(from_population->output[i]->type == EventType::Spike) {
            for(int j = 0; j < param->filter_length; j++) {
                input[i][j] += filter[j];
            }
        }
        static_cast<ValueEvent*>(output[i])->setValue(input[i][0]*param->threshold);
        to_population->setInput(0, output[i]);
        logger->logValue((long)this, i, EventType::Value, input[i][0]*param->threshold);
    }
}